

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_questtxt(char *infile,char *outfile)

{
  boolean bVar1;
  char *pcVar2;
  char *outfile_local;
  char *infile_local;
  
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
    exit(1);
  }
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    qt_hdr.n_hdr = 0;
    qt_line = 0;
    in_msg = '\0';
    while (pcVar2 = fgets(in_line,0x50,(FILE *)ifp), pcVar2 != (char *)0x0) {
      qt_line = qt_line + 1;
      bVar1 = qt_control(in_line);
      if (bVar1 == '\0') {
        bVar1 = qt_comment(in_line);
        if (bVar1 == '\0') {
          do_qt_text(in_line);
        }
      }
      else {
        do_qt_control(in_line);
      }
    }
    fseek((FILE *)ifp,0,0);
    in_msg = '\0';
    adjust_qt_hdrs();
    put_qt_hdrs();
    while (pcVar2 = fgets(in_line,0x50,(FILE *)ifp), pcVar2 != (char *)0x0) {
      bVar1 = qt_control(in_line);
      if (bVar1 == '\0') {
        bVar1 = qt_comment(in_line);
        if (bVar1 == '\0') {
          pcVar2 = xcrypt(in_line);
          fputs(pcVar2,(FILE *)ofp);
        }
      }
      else {
        in_msg = in_line[1] == 'C';
      }
    }
    fclose((FILE *)ifp);
    fclose((FILE *)ofp);
    return;
  }
  perror(outfile);
  fclose((FILE *)ifp);
  exit(1);
}

Assistant:

void do_questtxt(const char *infile, const char *outfile)
{
	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}

	if (!(ofp = fopen(outfile, WRBMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}

	qt_hdr.n_hdr = 0;
	qt_line = 0;
	in_msg = FALSE;

	while (fgets(in_line, 80, ifp) != 0) {
	    qt_line++;
	    if (qt_control(in_line)) do_qt_control(in_line);
	    else if (qt_comment(in_line)) continue;
	    else		    do_qt_text(in_line);
	}

	rewind(ifp);
	in_msg = FALSE;
	adjust_qt_hdrs();
	put_qt_hdrs();
	while (fgets(in_line, 80, ifp) != 0) {

		if (qt_control(in_line)) {
		    in_msg = (in_line[1] == 'C');
		    continue;
		} else if (qt_comment(in_line)) continue;
#ifdef DEBUG
		fprintf(stderr, "%ld: %s", ftell(stdout), in_line);
#endif
		fputs(xcrypt(in_line), ofp);
	}
	fclose(ifp);
	fclose(ofp);
	return;
}